

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_allocator.c
# Opt level: O0

void * memory_allocator_reallocate
                 (memory_allocator allocator,void *data,size_t size,size_t new_size)

{
  void *pvVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  void *new_data;
  
  pvVar1 = (void *)(**(code **)(*in_RDI + 0x10))(in_RDI[1],in_RSI,in_RDX,in_RCX);
  if (pvVar1 == (void *)0x0) {
    in_RDI[5] = in_RDI[5] + 1;
  }
  else {
    in_RDI[4] = in_RDI[4] + 1;
  }
  return pvVar1;
}

Assistant:

void *memory_allocator_reallocate(memory_allocator allocator, void *data, size_t size, size_t new_size)
{
	void *new_data = allocator->iface->reallocate(allocator->impl, data, size, new_size);

	if (new_data == NULL)
	{
		++allocator->size.bad_realloc;
	}
	else
	{
		++allocator->size.realloc;
	}

	return new_data;
}